

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

void __thiscall QAccessibleTabButton::doAction(QAccessibleTabButton *this,QString *actionName)

{
  char cVar1;
  bool bVar2;
  QString *s2;
  
  cVar1 = (**(code **)(*(long *)this + 0x10))();
  if (cVar1 != '\0') {
    s2 = (QString *)QAccessibleActionInterface::pressAction();
    bVar2 = ::comparesEqual(actionName,s2);
    if (bVar2) {
      QTabBar::setCurrentIndex((QTabBar *)(this->m_parent).wp.value,this->m_index);
      return;
    }
  }
  return;
}

Assistant:

void doAction(const QString &actionName) override
    {
        if (isValid() && actionName == pressAction())
            m_parent->setCurrentIndex(m_index);
    }